

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkSamplerCreateInfo *sampler,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  bool bVar1;
  GenericStringRef<char> local_138;
  GenericStringRef<char> local_128;
  GenericStringRef<char> local_118;
  GenericStringRef<char> local_108;
  GenericStringRef<char> local_f8;
  GenericStringRef<char> local_e8;
  GenericStringRef<char> local_d8;
  GenericStringRef<char> local_c8;
  GenericStringRef<char> local_b8;
  GenericStringRef<char> local_a8;
  GenericStringRef<char> local_98;
  GenericStringRef<char> local_88;
  GenericStringRef<char> local_78;
  GenericStringRef<char> local_68;
  GenericStringRef<char> local_58;
  GenericStringRef<char> local_48;
  undefined1 local_38 [8];
  Value s;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkSamplerCreateInfo *sampler_local;
  
  s.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_38,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_48,(char (*) [6])"flags");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_48,sampler->flags,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_58,(char (*) [10])"minFilter");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkFilter>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_38,&local_58,sampler->minFilter,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_68,(char (*) [10])"magFilter");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkFilter>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_38,&local_68,sampler->magFilter,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<14u>(&local_78,(char (*) [14])"maxAnisotropy")
  ;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_38,&local_78,sampler->maxAnisotropy,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_88,(char (*) [10])"compareOp");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkCompareOp>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_88,sampler->compareOp,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<17u>
            (&local_98,(char (*) [17])"anisotropyEnable");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_98,sampler->anisotropyEnable,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_a8,(char (*) [11])"mipmapMode");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerMipmapMode>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_a8,sampler->mipmapMode,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>(&local_b8,(char (*) [13])"addressModeU");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerAddressMode>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_b8,sampler->addressModeU,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>(&local_c8,(char (*) [13])"addressModeV");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerAddressMode>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_c8,sampler->addressModeV,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>(&local_d8,(char (*) [13])"addressModeW");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerAddressMode>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_d8,sampler->addressModeW,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<12u>(&local_e8,(char (*) [12])"borderColor");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkBorderColor>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_e8,sampler->borderColor,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<24u>
            (&local_f8,(char (*) [24])"unnormalizedCoordinates");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_f8,sampler->unnormalizedCoordinates,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<14u>
            (&local_108,(char (*) [14])"compareEnable");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_108,sampler->compareEnable,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_118,(char (*) [11])"mipLodBias");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_38,&local_118,sampler->mipLodBias,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_128,(char (*) [7])"minLod");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_38,&local_128,sampler->minLod,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_138,(char (*) [7])"maxLod");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<float>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_38,&local_138,sampler->maxLod,alloc);
  bVar1 = pnext_chain_add_json_value<VkSamplerCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((Value *)local_38,sampler,alloc,(DynamicStateInfo *)0x0);
  if (bVar1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    operator=(s.data_.a.elements,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_38);
  return bVar1;
}

Assistant:

static bool json_value(const VkSamplerCreateInfo& sampler, Allocator& alloc, Value *out_value)
{
	Value s(kObjectType);
	s.AddMember("flags", sampler.flags, alloc);
	s.AddMember("minFilter", sampler.minFilter, alloc);
	s.AddMember("magFilter", sampler.magFilter, alloc);
	s.AddMember("maxAnisotropy", sampler.maxAnisotropy, alloc);
	s.AddMember("compareOp", sampler.compareOp, alloc);
	s.AddMember("anisotropyEnable", sampler.anisotropyEnable, alloc);
	s.AddMember("mipmapMode", sampler.mipmapMode, alloc);
	s.AddMember("addressModeU", sampler.addressModeU, alloc);
	s.AddMember("addressModeV", sampler.addressModeV, alloc);
	s.AddMember("addressModeW", sampler.addressModeW, alloc);
	s.AddMember("borderColor", sampler.borderColor, alloc);
	s.AddMember("unnormalizedCoordinates", sampler.unnormalizedCoordinates, alloc);
	s.AddMember("compareEnable", sampler.compareEnable, alloc);
	s.AddMember("mipLodBias", sampler.mipLodBias, alloc);
	s.AddMember("minLod", sampler.minLod, alloc);
	s.AddMember("maxLod", sampler.maxLod, alloc);

	if (!pnext_chain_add_json_value(s, sampler, alloc, nullptr))
		return false;

	*out_value = s;
	return true;
}